

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

int __thiscall
CVmObjLookupTable::set_index_val_q
          (CVmObjLookupTable *this,vm_val_t *new_container,vm_obj_id_t self,vm_val_t *index_val,
          vm_val_t *new_val)

{
  vm_lookup_val *entry_00;
  CVmObjLookupTable *in_RCX;
  vm_obj_id_t in_EDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  undefined8 in_R8;
  vm_obj_id_t self_00;
  CVmObjLookupTable *unaff_retaddr;
  vm_lookup_val *entry;
  undefined4 in_stack_ffffffffffffffe8;
  
  self_00 = (vm_obj_id_t)((ulong)in_R8 >> 0x20);
  entry_00 = find_entry(unaff_retaddr,in_RDI,&in_RSI->typ,
                        (vm_lookup_val **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  if (entry_00 == (vm_lookup_val *)0x0) {
    add_entry_undo(in_RCX,self_00,(vm_val_t *)0x0,in_RDI);
  }
  else {
    set_entry_val_undo(in_RCX,self_00,entry_00,in_RDI);
  }
  vm_val_t::set_obj(in_RSI,in_EDX);
  return 1;
}

Assistant:

int CVmObjLookupTable::set_index_val_q(VMG_ vm_val_t *new_container,
                                       vm_obj_id_t self,
                                       const vm_val_t *index_val,
                                       const vm_val_t *new_val)
{
    vm_lookup_val *entry;
    
    /* look for an existing entry with this key */
    entry = find_entry(vmg_ index_val, 0, 0);

    /* if we found an existing entry, modify it; otherwise, add a new one */
    if (entry != 0)
    {   
        /* set the new value for this entry */
        set_entry_val_undo(vmg_ self, entry, new_val);
    }
    else
    {
        /* add a new entry with the given key */
        add_entry_undo(vmg_ self, index_val, new_val);
    }

    /* we can be modified, hence the new container is the original one */
    new_container->set_obj(self);

    /* handled */
    return TRUE;
}